

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,ProcessorInstance *i)

{
  if ((i->targetProcessor).object == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  (*this->_vptr_ASTVisitor[3])();
  if ((i->specialisationArgs).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((i->clockMultiplierRatio).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
  }
  if ((i->clockDividerRatio).object != (Expression *)0x0) {
    (*this->_vptr_ASTVisitor[3])(this);
    return;
  }
  return;
}

Assistant:

virtual void visit (AST::ProcessorInstance& i)
    {
        visitObject (*i.targetProcessor);
        visitObjectIfNotNull (i.specialisationArgs);
        visitObjectIfNotNull (i.clockMultiplierRatio);
        visitObjectIfNotNull (i.clockDividerRatio);
    }